

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checktet4split(tetgenmesh *this,triface *chktet,int *qflag,double *ccent)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  tetrahedron *pppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  TetSizeFunc p_Var8;
  bool bVar9;
  long lVar10;
  long lVar11;
  tetgenbehavior *ptVar12;
  ulong uVar13;
  tetgenmesh *this_00;
  tetgenmesh *this_01;
  long lVar14;
  int *piVar15;
  double (*padVar16) [3];
  undefined4 uVar17;
  undefined4 uVar18;
  uint uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar20;
  double dVar21;
  double dVar22;
  triface *ptVar23;
  undefined1 local_2b8 [16];
  double vdc [3];
  double vdb [3];
  double vda [3];
  int indx [4];
  undefined1 local_228 [16];
  double local_218;
  undefined8 local_208;
  undefined8 uStack_200;
  double N [4] [3];
  double vca [3];
  double vbc [3];
  double vab [3];
  double local_120;
  double adStack_118 [6];
  double A [4] [4];
  double local_60 [6];
  
  ptVar12 = this->b;
  pppdVar4 = chktet->tet;
  if (((ptVar12->convex == 0) ||
      ((double)pppdVar4[(long)this->elemattribindex + (long)this->numelemattrib + -1] != -1.0)) ||
     (NAN((double)pppdVar4[(long)this->elemattribindex + (long)this->numelemattrib + -1]))) {
    *qflag = 0;
    ppdVar5 = pppdVar4[7];
    if (ppdVar5 != (tetrahedron)this->dummypoint) {
      this_01 = (tetgenmesh *)pppdVar4[4];
      ppdVar6 = pppdVar4[5];
      ppdVar7 = pppdVar4[6];
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        dVar21 = (double)(&this_01->in)[lVar10] - (double)ppdVar5[lVar10];
        vda[lVar10] = dVar21;
        A[0][lVar10] = dVar21;
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        pdVar1 = ppdVar6[lVar10];
        pdVar2 = ppdVar5[lVar10];
        vdb[lVar10] = (double)pdVar1 - (double)pdVar2;
        A[1][lVar10] = (double)pdVar1 - (double)pdVar2;
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        pdVar1 = ppdVar7[lVar10];
        pdVar2 = ppdVar5[lVar10];
        vdc[lVar10] = (double)pdVar1 - (double)pdVar2;
        A[2][lVar10] = (double)pdVar1 - (double)pdVar2;
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        vab[lVar10] = (double)ppdVar6[lVar10] - (double)(&this_01->in)[lVar10];
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        vbc[lVar10] = (double)ppdVar7[lVar10] - (double)ppdVar6[lVar10];
      }
      for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
        vca[lVar10] = (double)(&this_01->in)[lVar10] - (double)ppdVar7[lVar10];
      }
      this_00 = this;
      local_208 = chktet;
      bVar9 = lu_decmp(this,A,3,indx,&local_120,0);
      if (bVar9) {
        iVar3 = ptVar12->varvolume;
        if ((iVar3 != 0 || ptVar12->fixedvolume != 0) &&
           (((dVar21 = ABS(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0,
             iVar3 == 0 || ptVar12->fixedvolume != 0 &&
             (ptVar12->maxvolume <= dVar21 && dVar21 != ptVar12->maxvolume)) ||
            ((iVar3 != 0 &&
             ((0.0 < (double)pppdVar4[this->volumeboundindex] &&
              ((double)pppdVar4[this->volumeboundindex] < dVar21)))))))) {
          *qflag = 1;
          local_228._8_8_ = (vdb[2] * vdb[2] + vdb[0] * vdb[0] + vdb[1] * vdb[1]) * 0.5;
          local_228._0_8_ = (vda[2] * vda[2] + vda[0] * vda[0] + vda[1] * vda[1]) * 0.5;
          local_218 = (vdc[2] * vdc[2] + vdc[0] * vdc[0] + vdc[1] * vdc[1]) * 0.5;
          lu_solve(this_00,A,3,indx,(double *)local_228,0);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            ccent[lVar10] = (double)ppdVar5[lVar10] + *(double *)(local_228 + lVar10 * 8);
          }
          return 1;
        }
        if (ptVar12->metric != 0) {
          local_228._8_8_ = (vdb[2] * vdb[2] + vdb[0] * vdb[0] + vdb[1] * vdb[1]) * 0.5;
          local_228._0_8_ = (vda[2] * vda[2] + vda[0] * vda[0] + vda[1] * vda[1]) * 0.5;
          local_218 = (vdc[2] * vdc[2] + vdc[0] * vdc[0] + vdc[1] * vdc[1]) * 0.5;
          lu_solve(this_00,A,3,indx,(double *)local_228,0);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            ccent[lVar10] = (double)ppdVar5[lVar10] + *(double *)(local_228 + lVar10 * 8);
          }
          lVar10 = 0;
          while (ptVar12 = (tetgenbehavior *)0x3, lVar10 != 4) {
            lVar14 = lVar10 + 4;
            lVar10 = lVar10 + 1;
            if ((0.0 < (double)pppdVar4[lVar14][this->pointmtrindex]) &&
               ((double)pppdVar4[lVar14][this->pointmtrindex] <
                SQRT(local_218 * local_218 +
                     (double)local_228._0_8_ * (double)local_228._0_8_ +
                     (double)local_228._8_8_ * (double)local_228._8_8_))) {
              *qflag = 1;
              return 1;
            }
          }
        }
        p_Var8 = this->in->tetunsuitable;
        if ((p_Var8 != (TetSizeFunc)0x0) &&
           (bVar9 = (*p_Var8)((double *)this_01,(double *)ppdVar6,(double *)ppdVar7,
                              (double *)ppdVar5,(double *)0x0,0.0), this_00 = this_01, bVar9)) {
          local_228._8_8_ = (vdb[2] * vdb[2] + vdb[0] * vdb[0] + vdb[1] * vdb[1]) * 0.5;
          local_228._0_8_ = (vda[2] * vda[2] + vda[0] * vda[0] + vda[1] * vda[1]) * 0.5;
          local_218 = (vdc[2] * vdc[2] + vdc[0] * vdc[0] + vdc[1] * vdc[1]) * 0.5;
          lu_solve(this_01,A,3,indx,(double *)local_228,0);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            ccent[lVar10] = (double)ppdVar5[lVar10] + *(double *)(local_228 + lVar10 * 8);
          }
          return 1;
        }
        if (this->useinsertradius == 0) {
          ptVar12 = this->b;
          local_2b8._0_8_ = 0.0;
        }
        else {
          pppdVar4 = local_208->tet;
          local_2b8 = ZEXT816(0);
          piVar15 = edge2ver;
          for (uVar13 = 0; uVar13 != 6; uVar13 = uVar13 + 1) {
            this_00 = this;
            dVar21 = distance(this,(double *)pppdVar4[orgpivot[*piVar15]],
                              (double *)pppdVar4[destpivot[*piVar15]]);
            adStack_118[uVar13] = dVar21;
            if (uVar13 == 0) {
              ptVar12 = (tetgenbehavior *)0x0;
              local_2b8._8_4_ = extraout_XMM0_Dc;
              local_2b8._0_8_ = dVar21;
              local_2b8._12_4_ = extraout_XMM0_Dd;
            }
            else if (dVar21 < (double)local_2b8._0_8_) {
              local_2b8._8_4_ = extraout_XMM0_Dc;
              local_2b8._0_8_ = dVar21;
              local_2b8._12_4_ = extraout_XMM0_Dd;
              ptVar12 = (tetgenbehavior *)(uVar13 & 0xffffffff);
            }
            piVar15 = piVar15 + 1;
          }
          pdVar1 = pppdVar4[orgpivot[edge2ver[(int)ptVar12]]][this->pointinsradiusindex];
          uVar17 = SUB84(pdVar1,0);
          uVar18 = (undefined4)((ulong)pdVar1 >> 0x20);
          pdVar2 = pppdVar4[destpivot[edge2ver[(int)ptVar12]]][this->pointinsradiusindex];
          if ((0.0 < (double)pdVar2) &&
             (((double)pdVar1 <= 0.0 || ((double)pdVar2 < (double)pdVar1)))) {
            uVar17 = SUB84(pdVar2,0);
            uVar18 = (undefined4)((ulong)pdVar2 >> 0x20);
          }
          ptVar12 = this->b;
          if ((0.0 <= (double)CONCAT44(uVar18,uVar17) && (double)CONCAT44(uVar18,uVar17) != 0.0) &&
             (uVar13 = -(ulong)(ABS((double)CONCAT44(uVar18,uVar17) - (double)local_2b8._0_8_) /
                                (double)local_2b8._0_8_ < ptVar12->epsilon),
             (double)local_2b8._0_8_ <
             (double)(~uVar13 & CONCAT44(uVar18,uVar17) | uVar13 & local_2b8._0_8_))) {
            return 0;
          }
        }
        if (0.0 < ptVar12->minratio) {
          local_208 = (triface *)(vda[2] * vda[2] + vda[0] * vda[0] + vda[1] * vda[1]);
          dVar20 = vdb[2] * vdb[2] + vdb[0] * vdb[0] + vdb[1] * vdb[1];
          dVar22 = vdc[2] * vdc[2] + vdc[0] * vdc[0] + vdc[1] * vdc[1];
          uStack_200 = 0;
          dVar21 = dVar20 * 0.5;
          local_228._8_4_ = SUB84(dVar21,0);
          local_228._0_8_ = (double)local_208 * 0.5;
          local_228._12_4_ = (int)((ulong)dVar21 >> 0x20);
          local_218 = dVar22 * 0.5;
          lu_solve(this_00,A,3,indx,(double *)local_228,0);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            ccent[lVar10] = (double)ppdVar5[lVar10] + *(double *)(local_228 + lVar10 * 8);
          }
          ptVar23 = (triface *)
                    SQRT(local_218 * local_218 +
                         (double)local_228._0_8_ * (double)local_228._0_8_ +
                         (double)local_228._8_8_ * (double)local_228._8_8_);
          if (this->useinsertradius == 0) {
            adStack_118[1] = dVar20;
            adStack_118[2] = dVar22;
            adStack_118[3] = vab[2] * vab[2] + vab[0] * vab[0] + vab[1] * vab[1];
            adStack_118[4] = vbc[2] * vbc[2] + vbc[0] * vbc[0] + vbc[1] * vbc[1];
            adStack_118[5] = vca[2] * vca[2] + vca[0] * vca[0] + vca[1] * vca[1];
            uVar17 = (undefined4)local_208;
            uVar18 = local_208._4_4_;
            for (lVar10 = 1; lVar10 != 6; lVar10 = lVar10 + 1) {
              dVar21 = adStack_118[lVar10];
              if ((double)CONCAT44(uVar18,uVar17) <= dVar21) {
                dVar21 = (double)CONCAT44(uVar18,uVar17);
              }
              uVar17 = SUB84(dVar21,0);
              uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
            }
            if ((double)CONCAT44(uVar18,uVar17) < 0.0) {
              local_208 = ptVar23;
              local_2b8._0_8_ = sqrt((double)CONCAT44(uVar18,uVar17));
              ptVar23 = local_208;
            }
            else {
              local_2b8._0_8_ = SQRT((double)CONCAT44(uVar18,uVar17));
            }
            ptVar12 = this->b;
          }
          if (ptVar12->minratio <= (double)ptVar23 / (double)local_2b8._0_8_ &&
              (double)ptVar23 / (double)local_2b8._0_8_ != ptVar12->minratio) {
            return 1;
          }
        }
        if (ptVar12->mindihedral <= 0.0) {
          return 0;
        }
        lVar10 = 1;
        padVar16 = N;
        for (lVar14 = 0; lVar11 = 0, lVar14 != 3; lVar14 = lVar14 + 1) {
          for (; lVar11 != 3; lVar11 = lVar11 + 1) {
            (*padVar16)[lVar11] = 0.0;
          }
          N[lVar14][lVar14] = 1.0;
          lu_solve(this_00,A,3,indx,N[lVar14],0);
          padVar16 = padVar16 + 1;
        }
        for (; lVar11 != 3; lVar11 = lVar11 + 1) {
          vca[lVar11 + -3] = (-vca[lVar11 + -0xc] - vca[lVar11 + -9]) - vca[lVar11 + -6];
        }
        padVar16 = N;
        for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
          dVar21 = SQRT(N[lVar14][2] * N[lVar14][2] +
                        N[lVar14][0] * N[lVar14][0] + N[lVar14][1] * N[lVar14][1]);
          if ((dVar21 == 0.0) && (!NAN(dVar21))) {
            this_00 = this;
            terminatetetgen(this,2);
          }
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            (*padVar16)[lVar11] = (*padVar16)[lVar11] / dVar21;
          }
          padVar16 = padVar16 + 1;
        }
        dVar21 = N[0][2] * N[1][2] + N[0][0] * N[1][0] + N[0][1] * N[1][1];
        uVar19 = (uint)((ulong)dVar21 >> 0x20) ^ 0x80000000;
        uVar17 = SUB84(dVar21,0);
        local_60[0] = -(N[0][2] * N[2][2] + N[0][0] * N[2][0] + N[0][1] * N[2][1]);
        local_60[1] = -(N[0][2] * N[3][2] + N[0][0] * N[3][0] + N[0][1] * N[3][1]);
        local_60[2] = -(N[1][2] * N[2][2] + N[1][0] * N[2][0] + N[1][1] * N[2][1]);
        local_60[3] = -(N[1][2] * N[3][2] + N[1][0] * N[3][0] + N[1][1] * N[3][1]);
        local_60[4] = -(N[2][2] * N[3][2] + N[2][0] * N[3][0] + N[2][1] * N[3][1]);
        for (; lVar10 != 6; lVar10 = lVar10 + 1) {
          dVar21 = local_60[lVar10 + -1];
          if (dVar21 <= (double)CONCAT44(uVar19,uVar17)) {
            dVar21 = (double)CONCAT44(uVar19,uVar17);
          }
          uVar17 = SUB84(dVar21,0);
          uVar19 = (uint)((ulong)dVar21 >> 0x20);
        }
        if (this->cosmindihed <= (double)CONCAT44(uVar19,uVar17) &&
            (double)CONCAT44(uVar19,uVar17) != this->cosmindihed) {
          local_228._8_8_ = (vdb[2] * vdb[2] + vdb[0] * vdb[0] + vdb[1] * vdb[1]) * 0.5;
          local_228._0_8_ = (vda[2] * vda[2] + vda[0] * vda[0] + vda[1] * vda[1]) * 0.5;
          local_218 = (vdc[2] * vdc[2] + vdc[0] * vdc[0] + vdc[1] * vdc[1]) * 0.5;
          lu_solve(this_00,A,3,indx,(double *)local_228,0);
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            ccent[lVar10] = (double)ppdVar5[lVar10] + *(double *)(local_228 + lVar10 * 8);
          }
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checktet4split(triface *chktet, int &qflag, REAL *ccent) 
{
  point pa, pb, pc, pd, *ppt;
  REAL vda[3], vdb[3], vdc[3];
  REAL vab[3], vbc[3], vca[3];
  REAL N[4][3], L[4], cosd[6], elen[6];
  REAL maxcosd, vol, volbnd, smlen = 0, rd;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i, j;

  if (b->convex) { // -c
    // Skip this tet if it lies in the exterior.
    if (elemattribute(chktet->tet, numelemattrib - 1) == -1.0) {
      return 0;
    }
  }

  qflag = 0;

  pd = (point) chktet->tet[7];
  if (pd == dummypoint) {
    return 0; // Do not split a hull tet.
  }

  pa = (point) chktet->tet[4];
  pb = (point) chktet->tet[5];
  pc = (point) chktet->tet[6];

  // Get the edge vectors vda: d->a, vdb: d->b, vdc: d->c.
  // Set the matrix A = [vda, vdb, vdc]^T.
  for (i = 0; i < 3; i++) A[0][i] = vda[i] = pa[i] - pd[i];
  for (i = 0; i < 3; i++) A[1][i] = vdb[i] = pb[i] - pd[i];
  for (i = 0; i < 3; i++) A[2][i] = vdc[i] = pc[i] - pd[i];

  // Get the other edge vectors.
  for (i = 0; i < 3; i++) vab[i] = pb[i] - pa[i];
  for (i = 0; i < 3; i++) vbc[i] = pc[i] - pb[i];
  for (i = 0; i < 3; i++) vca[i] = pa[i] - pc[i];

  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerated tet (vol = 0).
    // This is possible due to the use of exact arithmetic.  We temporarily
    //   leave this tet. It should be fixed by mesh optimization.
    return 0; 
  }

  // Check volume if '-a#' and '-a' options are used.
  if (b->varvolume || b->fixedvolume) {
    vol = fabs(A[indx[0]][0] * A[indx[1]][1] * A[indx[2]][2]) / 6.0;
    if (b->fixedvolume) {
      if (vol > b->maxvolume) {
        qflag = 1;
      }
    } 
    if (!qflag && b->varvolume) {
      volbnd = volumebound(chktet->tet);
      if ((volbnd > 0.0) && (vol > volbnd)) {
        qflag = 1;
      }
    }
    if (qflag == 1) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Calculate the circumradius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    // Check if the ccent lies outside one of the prot.balls at vertices.
    ppt = (point *) &(chktet->tet[4]);
    for (i = 0; i < 4; i++) {
      if (ppt[i][pointmtrindex] > 0) {
        if (rd > ppt[i][pointmtrindex]) {
          qflag = 1; // Enforce mesh size.
          return 1;
        }
      }
    }
  }

  if (in->tetunsuitable != NULL) {
    // Execute the user-defined meshing sizing evaluation.
    if ((*(in->tetunsuitable))(pa, pb, pc, pd, NULL, 0)) {
      // Calculate the circumcenter of this tet.
      rhs[0] = 0.5 * dot(vda, vda);
      rhs[1] = 0.5 * dot(vdb, vdb);
      rhs[2] = 0.5 * dot(vdc, vdc);
      lu_solve(A, 3, indx, rhs, 0);            
      for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
      return 1;
    }
  }

  if (useinsertradius) {
    // Do not split this tet if the shortest edge is shorter than the
    //   insertion radius of one of its endpoints.
    triface checkedge;
    point e1, e2;
    REAL rrv, smrrv;

    // Get the shortest edge of this tet.
    checkedge.tet = chktet->tet;
    for (i = 0; i < 6; i++) {
      checkedge.ver = edge2ver[i];
      e1 = org(checkedge);
      e2 = dest(checkedge);
      elen[i] = distance(e1, e2);
      if (i == 0) {
        smlen = elen[i];
        j = 0;
      } else {
        if (elen[i] < smlen) {
          smlen = elen[i];
          j = i;
        }
      }
    }
    // Check if the edge is too short.
    checkedge.ver = edge2ver[j];
    // Get the smallest rrv of e1 and e2.
    // Note: if rrv of e1 and e2 is zero. Do not use it.
    e1 = org(checkedge);
    smrrv = getpointinsradius(e1);
    e2 = dest(checkedge);
    rrv = getpointinsradius(e2);
    if (rrv > 0) {
      if (smrrv > 0) {
        if (rrv < smrrv) {
          smrrv = rrv;
        }
      } else {
        smrrv = rrv;
      }
    }
    if (smrrv > 0) {
      // To avoid rounding error, round smrrv before doing comparison.
      if ((fabs(smrrv - smlen) / smlen) < b->epsilon) {
        smrrv = smlen;
      }
      if (smrrv > smlen) {
        return 0;
      }
    }
  } // if (useinsertradius)

  // Check the radius-edge ratio. Set by -q#.
  if (b->minratio > 0) { 
    // Calculate the circumcenter and radius of this tet.
    rhs[0] = 0.5 * dot(vda, vda);
    rhs[1] = 0.5 * dot(vdb, vdb);
    rhs[2] = 0.5 * dot(vdc, vdc);
    lu_solve(A, 3, indx, rhs, 0);            
    for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
    rd = sqrt(dot(rhs, rhs));
    if (!useinsertradius) {
      // Calculate the shortest edge length.
      elen[0] = dot(vda, vda);
      elen[1] = dot(vdb, vdb);
      elen[2] = dot(vdc, vdc);
      elen[3] = dot(vab, vab);
      elen[4] = dot(vbc, vbc);
      elen[5] = dot(vca, vca);
      smlen = elen[0]; //sidx = 0;
      for (i = 1; i < 6; i++) {
        if (smlen > elen[i]) { 
          smlen = elen[i]; //sidx = i; 
        }
      }
      smlen = sqrt(smlen);
    }
    D = rd / smlen;
    if (D > b->minratio) {
      // A bad radius-edge ratio.
      return 1;
    }
  }

  // Check the minimum dihedral angle. Set by -qq#.
  if (b->mindihedral > 0) { 
    // Compute the 4 face normals (N[0], ..., N[3]).
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) N[j][i] = 0.0;
      N[j][j] = 1.0;  // Positive means the inside direction
      lu_solve(A, 3, indx, N[j], 0);
    }
    for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
    // Normalize the normals.
    for (i = 0; i < 4; i++) {
      L[i] = sqrt(dot(N[i], N[i]));
      if (L[i] == 0) {
        terminatetetgen(this, 2);
      }
      for (j = 0; j < 3; j++) N[i][j] /= L[i];
    }
    // Calculate the six dihedral angles.
    cosd[0] = -dot(N[0], N[1]); // Edge cd, bd, bc.
    cosd[1] = -dot(N[0], N[2]);
    cosd[2] = -dot(N[0], N[3]);
    cosd[3] = -dot(N[1], N[2]); // Edge ad, ac
    cosd[4] = -dot(N[1], N[3]);
    cosd[5] = -dot(N[2], N[3]); // Edge ab
    // Get the smallest dihedral angle.
    //maxcosd = mincosd = cosd[0];
    maxcosd = cosd[0];
    for (i = 1; i < 6; i++) {
      //if (cosd[i] > maxcosd) maxcosd = cosd[i];
      maxcosd = (cosd[i] > maxcosd ? cosd[i] : maxcosd);
      //mincosd = (cosd[i] < mincosd ? cosd[i] : maxcosd);
    }
    if (maxcosd > cosmindihed) {
      // Calculate the circumcenter of this tet.
      // A bad dihedral angle.
      //if ((b->quality & 1) == 0) {
        rhs[0] = 0.5 * dot(vda, vda);
        rhs[1] = 0.5 * dot(vdb, vdb);
        rhs[2] = 0.5 * dot(vdc, vdc);
        lu_solve(A, 3, indx, rhs, 0);            
        for (i = 0; i < 3; i++) ccent[i] = pd[i] + rhs[i];
        //*rd = sqrt(dot(rhs, rhs));
      //}
      return 1;
    }
  }

  return 0;
}